

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::SubElement(TPZGeoElRefLess<pzgeom::TPZArc3D> *this,int is)

{
  long *plVar1;
  
  if (1 < (uint)is) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZGeoElRefLess::SubElement index error is= ",0x2c);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,is);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  return (TPZGeoEl *)0x0;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::SubElement(int is) const {
	if(is<0 || is>1){//(TRef::NSubEl - 1)){
		std::cout << "TPZGeoElRefLess::SubElement index error is= " << is << std::endl;
	}
	//  return fSubEl[is];
	return 0;
}